

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* read_all_lines_abi_cxx11_
            (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *__return_storage_ptr__,char *filename)

{
  FILE *__stream;
  __ssize_t _Var1;
  char *line_buf;
  string line;
  size_t line_size;
  allocator local_61;
  char *local_60;
  value_type local_58;
  size_t local_38;
  
  __stream = fopen(filename,"r");
  local_38 = 0;
  local_60 = (char *)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    _Var1 = getline(&local_60,&local_38,__stream);
    if (_Var1 < 1) break;
    std::__cxx11::string::string((string *)&local_58,local_60,&local_61);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
  }
  free(local_60);
  local_60 = (char *)0x0;
  fclose(__stream);
  return __return_storage_ptr__;
}

Assistant:

Vector<String> read_all_lines(const char * filename){
    FILE* file = fopen(filename, "r");
    size_t line_size=0;
    char* line_buf=0;
    Vector<String> lines;
    while (getline(&line_buf, &line_size, file)>0) {
        String line = line_buf;
        lines.push_back(line);
    }
    free(line_buf);
    line_buf=NULL;
    fclose(file);
    return lines;
}